

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O2

Gia_Man_t * Gia_ManFromMiniAig(Mini_Aig_t *p,Vec_Int_t **pvCopies)

{
  uint __line;
  int nObjsMax;
  int iVar1;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar2;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar3;
  int Id;
  
  nObjsMax = p->nSize / 2;
  p_00 = Gia_ManStart(nObjsMax);
  pcVar2 = Abc_UtilStrsav("MiniAig");
  p_00->pName = pcVar2;
  p_01 = Vec_IntAlloc(nObjsMax);
  Vec_IntPush(p_01,0);
  Gia_ManHashAlloc(p_00);
  Id = 1;
  do {
    if (nObjsMax <= Id) {
      Gia_ManHashStop(p_00);
      if (p_01->nSize == nObjsMax) {
        if (pvCopies == (Vec_Int_t **)0x0) {
          Vec_IntFree(p_01);
        }
        else {
          *pvCopies = p_01;
        }
        Gia_ManSetRegNum(p_00,p->nRegs);
        pGVar3 = Gia_ManCleanup(p_00);
        if (pvCopies != (Vec_Int_t **)0x0) {
          Gia_ManDupRemapLiterals(*pvCopies,p_00);
        }
        Gia_ManStop(p_00);
        return pGVar3;
      }
      pcVar2 = "Vec_IntSize(vCopies) == nNodes";
      __line = 0x57;
LAB_005ff741:
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                    ,__line,"Gia_Man_t *Gia_ManFromMiniAig(Mini_Aig_t *, Vec_Int_t **)");
    }
    iVar1 = Mini_AigNodeIsPi(p,Id);
    if (iVar1 == 0) {
      pGVar3 = (Gia_Man_t *)p;
      iVar1 = Mini_AigNodeIsPo(p,Id);
      if (iVar1 == 0) {
        pGVar3 = (Gia_Man_t *)p;
        iVar1 = Mini_AigNodeIsAnd(p,Id);
        if (iVar1 == 0) {
          pcVar2 = "0";
          __line = 0x53;
          goto LAB_005ff741;
        }
        iVar1 = Gia_ObjFromMiniFanin0Copy(pGVar3,p_01,p,Id);
        iLit1 = Gia_ObjFromMiniFanin1Copy(pGVar3,p_01,p,Id);
        iVar1 = Gia_ManHashAnd(p_00,iVar1,iLit1);
      }
      else {
        iVar1 = Gia_ObjFromMiniFanin0Copy(pGVar3,p_01,p,Id);
        iVar1 = Gia_ManAppendCo(p_00,iVar1);
      }
    }
    else {
      iVar1 = Gia_ManAppendCi(p_00);
    }
    Vec_IntPush(p_01,iVar1);
    Id = Id + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManFromMiniAig( Mini_Aig_t * p, Vec_Int_t ** pvCopies )
{
    Gia_Man_t * pGia, * pTemp;
    Vec_Int_t * vCopies;
    int i, iGiaLit = 0, nNodes;
    // get the number of nodes
    nNodes = Mini_AigNodeNum(p);
    // create ABC network
    pGia = Gia_ManStart( nNodes );
    pGia->pName = Abc_UtilStrsav( "MiniAig" );
    // create mapping from MiniAIG objects into ABC objects
    vCopies = Vec_IntAlloc( nNodes );
    Vec_IntPush( vCopies, 0 );
    // iterate through the objects
    Gia_ManHashAlloc( pGia );
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
            iGiaLit = Gia_ManAppendCi(pGia);
        else if ( Mini_AigNodeIsPo( p, i ) )
            iGiaLit = Gia_ManAppendCo(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i));
        else if ( Mini_AigNodeIsAnd( p, i ) )
            iGiaLit = Gia_ManHashAnd(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i), Gia_ObjFromMiniFanin1Copy(pGia, vCopies, p, i));
        else assert( 0 );
        Vec_IntPush( vCopies, iGiaLit );
    }
    Gia_ManHashStop( pGia );
    assert( Vec_IntSize(vCopies) == nNodes );
    if ( pvCopies )
        *pvCopies = vCopies;
    else
        Vec_IntFree( vCopies );
    Gia_ManSetRegNum( pGia, Mini_AigRegNum(p) );
    pGia = Gia_ManCleanup( pTemp = pGia );
    if ( pvCopies )
        Gia_ManDupRemapLiterals( *pvCopies, pTemp );
    Gia_ManStop( pTemp );
    return pGia;
}